

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ManCountMapRefsOne(Lf_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Lf_Bst_t *pLVar3;
  int *piVar4;
  Jf_Par_t *pJVar5;
  Lf_Cut_t *pLVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  double dVar12;
  
  if ((-1 < iObj) && (iObj < (p->vOffsets).nSize)) {
    pLVar3 = p->pObjBests;
    iVar1 = (p->vOffsets).pArray[(uint)iObj];
    pLVar6 = Lf_ObjCutBest(p,iObj);
    if ((iObj < (p->vRequired).nSize) && (iObj < (p->vOffsets).nSize)) {
      iVar2 = (p->vOffsets).pArray[(uint)iObj];
      if ((-1 < (long)iVar2) && (iVar2 < (p->vMapRefs).nSize)) {
        if ((p->vMapRefs).pArray[iVar2] < 1) {
          __assert_fail("Lf_ObjMapRefNum(p, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                        ,0x62e,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
        }
        if ((((uint)pLVar3[iVar1].Cut[1] ^ (uint)pLVar3[iVar1].Cut[0]) & 1) == 0) {
          __assert_fail("Lf_BestIsMapped(pBest)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                        ,0x62f,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
        }
        uVar7 = *(uint *)&pLVar6->field_0x14;
        if ((uVar7 >> 0x17 & 1) != 0) {
          __assert_fail("!pCut->fMux7",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                        ,0x630,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
        }
        if (uVar7 < 0x1000000) {
          uVar9 = (ulong)(uVar7 >> 0x18);
        }
        else {
          piVar4 = (p->vRequired).pArray;
          iVar1 = piVar4[(uint)iObj];
          uVar8 = 0;
          do {
            iVar2 = *(int *)((long)&pLVar6[1].Sign + uVar8 * 4);
            lVar10 = (long)iVar2;
            if ((lVar10 < 0) || ((p->vRequired).nSize <= iVar2)) goto LAB_006dc8e3;
            if (iVar1 <= piVar4[lVar10]) {
              piVar4[lVar10] = iVar1 + -1;
              uVar7 = *(uint *)&pLVar6->field_0x14;
            }
            uVar8 = uVar8 + 1;
            uVar9 = (ulong)(uVar7 >> 0x18);
          } while (uVar8 < uVar9);
        }
        iVar1 = (p->vSwitches).nSize;
        if (iVar1 != 0) {
          dVar12 = 0.0;
          if (0xffffff < uVar7) {
            fVar11 = 0.0;
            uVar8 = 0;
            do {
              iVar2 = *(int *)((long)&pLVar6[1].Sign + uVar8 * 4);
              if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                              ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
              }
              fVar11 = fVar11 + (p->vSwitches).pArray[iVar2];
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
            dVar12 = (double)fVar11;
          }
          p->Switches = dVar12 + p->Switches;
          uVar7 = *(uint *)&pLVar6->field_0x14;
        }
        pJVar5 = p->pPars;
        pJVar5->Area = pJVar5->Area + 1;
        pJVar5->Edge = (ulong)(uVar7 >> 0x18) + pJVar5->Edge;
        return;
      }
    }
  }
LAB_006dc8e3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Lf_ManCountMapRefsOne( Lf_Man_t * p, int iObj )
{
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, iObj );
    Lf_Cut_t * pCut = Lf_ObjCutBest( p, iObj );
    int k ,Required = Lf_ObjRequired( p, iObj );
    assert( Lf_ObjMapRefNum(p, iObj) > 0 );
    assert( Lf_BestIsMapped(pBest) );
    assert( !pCut->fMux7 );
//    assert( pCut->Delay <= Required );
    for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required - 1 );
    if ( Vec_FltSize(&p->vSwitches) )
        p->Switches += Lf_CutSwitches(p, pCut);
    p->pPars->Edge += pCut->nLeaves;
    p->pPars->Area++;
}